

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O0

int rtosc_arg_vals_cmp_single(rtosc_arg_val_t *_lhs,rtosc_arg_val_t *_rhs,rtosc_cmp_options *opt)

{
  int iVar1;
  char cVar2;
  char cVar3;
  rtosc_cmp_options *in_RDX;
  char *in_RSI;
  rtosc_arg_val_t *in_RDI;
  rtosc_arg_val_t *unaff_retaddr;
  int32_t rlen;
  int32_t llen;
  int32_t minlen;
  int32_t rbs;
  int32_t lbs;
  int rval;
  int local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_68;
  uint local_64;
  double local_60;
  uint local_50;
  uint local_4c;
  float local_48;
  uint local_40;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RDX == (rtosc_cmp_options *)0x0) {
    in_RDX = &default_cmp_options;
  }
  if (in_RDI->type == *in_RSI) {
    switch(in_RDI->type) {
    case '-':
      local_68 = 0xffffffff;
      break;
    default:
      local_68 = 0xffffffff;
      break;
    case 'F':
    case 'I':
    case 'N':
    case 'T':
      local_68 = 0;
      break;
    case 'S':
    case 's':
      if (((in_RDI->val).h == 0) || (*(long *)(in_RSI + 8) == 0)) {
        if ((in_RDI->val).h == *(long *)(in_RSI + 8)) {
          local_78 = 0;
          local_68 = local_78;
        }
        else {
          local_68 = 0xffffffff;
          if (*(ulong *)(in_RSI + 8) < (in_RDI->val).t) {
            local_68 = 1;
          }
        }
      }
      else {
        local_68 = strcmp((in_RDI->val).s,*(char **)(in_RSI + 8));
      }
      break;
    case 'a':
      rtosc_av_arr_len((rtosc_arg_val_t *)0x121d87);
      rtosc_av_arr_len((rtosc_arg_val_t *)0x121d98);
      cVar2 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121da9);
      cVar3 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121dbd);
      if (((cVar2 == cVar3) ||
          ((cVar2 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121ddb), cVar2 == 'T' &&
           (cVar2 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121df0), cVar2 != '\0')))) ||
         ((cVar2 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121e05), cVar2 == 'F' &&
          (cVar2 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121e1a), cVar2 != '\0')))) {
        local_68 = rtosc_arg_vals_cmp(unaff_retaddr,in_RDI,(size_t)in_RSI,(size_t)in_RDX,
                                      (rtosc_cmp_options *)
                                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
        ;
      }
      else {
        cVar2 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121e2f);
        cVar3 = rtosc_av_arr_type((rtosc_arg_val_t *)0x121e43);
        local_68 = 0xffffffff;
        if (cVar3 < cVar2) {
          local_68 = 1;
        }
      }
      break;
    case 'b':
      iVar4 = (in_RDI->val).i;
      iVar1 = *(int *)(in_RSI + 8);
      local_80 = iVar1;
      if (iVar4 < iVar1) {
        local_80 = iVar4;
      }
      local_68 = memcmp((in_RDI->val).b.data,*(void **)(in_RSI + 0x10),(long)local_80);
      if ((iVar4 != iVar1) && (local_68 == 0)) {
        if (iVar1 < iVar4) {
          local_68 = (uint)(in_RDI->val).b.data[local_80];
        }
        else {
          local_68 = -(uint)*(byte *)(*(long *)(in_RSI + 0x10) + (long)local_80);
        }
      }
      break;
    case 'c':
    case 'i':
    case 'r':
      if ((in_RDI->val).i == *(int *)(in_RSI + 8)) {
        local_3c = 0;
        local_68 = local_3c;
      }
      else {
        local_68 = 0xffffffff;
        if (*(int *)(in_RSI + 8) < (in_RDI->val).i) {
          local_68 = 1;
        }
      }
      break;
    case 'd':
      if ((in_RDX->float_tolerance != 0.0) || (NAN(in_RDX->float_tolerance))) {
        if ((in_RDI->val).d - *(double *)(in_RSI + 8) < 0.0) {
          local_60 = -((in_RDI->val).d - *(double *)(in_RSI + 8));
        }
        else {
          local_60 = (in_RDI->val).d - *(double *)(in_RSI + 8);
        }
        if (in_RDX->float_tolerance < local_60) {
          local_68 = 0xffffffff;
          if (*(double *)(in_RSI + 8) < (in_RDI->val).d) {
            local_68 = 1;
          }
        }
        else {
          local_64 = 0;
          local_68 = local_64;
        }
      }
      else if (((in_RDI->val).d != *(double *)(in_RSI + 8)) ||
              (NAN((in_RDI->val).d) || NAN(*(double *)(in_RSI + 8)))) {
        local_68 = 0xffffffff;
        if (*(double *)(in_RSI + 8) < (in_RDI->val).d) {
          local_68 = 1;
        }
      }
      else {
        local_50 = 0;
        local_68 = local_50;
      }
      break;
    case 'f':
      if ((in_RDX->float_tolerance != 0.0) || (NAN(in_RDX->float_tolerance))) {
        if ((in_RDI->val).f - *(float *)(in_RSI + 8) < 0.0) {
          local_48 = -((in_RDI->val).f - *(float *)(in_RSI + 8));
        }
        else {
          local_48 = (in_RDI->val).f - *(float *)(in_RSI + 8);
        }
        if ((float)in_RDX->float_tolerance < local_48) {
          local_68 = 0xffffffff;
          if (*(float *)(in_RSI + 8) < (in_RDI->val).f) {
            local_68 = 1;
          }
        }
        else {
          local_4c = 0;
          local_68 = local_4c;
        }
      }
      else if (((in_RDI->val).f != *(float *)(in_RSI + 8)) ||
              (NAN((in_RDI->val).f) || NAN(*(float *)(in_RSI + 8)))) {
        local_68 = 0xffffffff;
        if (*(float *)(in_RSI + 8) < (in_RDI->val).f) {
          local_68 = 1;
        }
      }
      else {
        local_40 = 0;
        local_68 = local_40;
      }
      break;
    case 'h':
      if ((in_RDI->val).h == *(long *)(in_RSI + 8)) {
        local_68 = 0;
      }
      else {
        local_68 = 0xffffffff;
        if (*(long *)(in_RSI + 8) < (in_RDI->val).h) {
          local_68 = 1;
        }
      }
      break;
    case 'm':
      local_68 = memcmp(&in_RDI->val,in_RSI + 8,4);
      break;
    case 't':
      if ((in_RDI->val).h == 1) {
        local_68 = 0xffffffff;
        if (*(long *)(in_RSI + 8) == 1) {
          local_68 = 0;
        }
      }
      else if (*(long *)(in_RSI + 8) == 1) {
        local_70 = 1;
        local_68 = local_70;
      }
      else if ((in_RDI->val).h == *(long *)(in_RSI + 8)) {
        local_74 = 0;
        local_68 = local_74;
      }
      else {
        local_68 = 0xffffffff;
        if (*(ulong *)(in_RSI + 8) < (in_RDI->val).t) {
          local_68 = 1;
        }
      }
    }
  }
  else {
    local_68 = 0xffffffff;
    if (*in_RSI < in_RDI->type) {
      local_68 = 1;
    }
  }
  return local_68;
}

Assistant:

int rtosc_arg_vals_cmp_single(const rtosc_arg_val_t* _lhs,
                              const rtosc_arg_val_t* _rhs,
                              const rtosc_cmp_options* opt)
{
#define cmp_3way(val1,val2) (((val1) == (val2)) \
                            ? 0 \
                            : (((val1) > (val2)) ? 1 : -1))
#define mfabs(val) (((val) >= 0) ? (val) : -(val))

    int rval;

    if(!opt)
        opt = &default_cmp_options;

    if(_lhs->type == _rhs->type)
    switch(_lhs->type)
    {
        case 'i':
        case 'c':
        case 'r':
            rval = cmp_3way(_lhs->val.i, _rhs->val.i);
            break;
        case 'I':
        case 'T':
        case 'F':
        case 'N':
            rval = 0;
            break;
        case 'f':
            rval = (opt->float_tolerance == 0.0)
                   ? cmp_3way(_lhs->val.f, _rhs->val.f)
                   : (mfabs(_lhs->val.f - _rhs->val.f)
                      <= (float)opt->float_tolerance)
                      ? 0
                      : ((_lhs->val.f > _rhs->val.f) ? 1 : -1);
            break;
        case 'd':
            rval = (opt->float_tolerance == 0.0)
                   ? cmp_3way(_lhs->val.d, _rhs->val.d)
                   : (mfabs(_lhs->val.d - _rhs->val.d)
                      <= opt->float_tolerance)
                      ? 0
                      : ((_lhs->val.d > _rhs->val.d) ? 1 : -1);
            break;
        case 'h':
            rval = cmp_3way(_lhs->val.h, _rhs->val.h);
            break;
        case 't':
            // immediately is considered lower than everything else
            // this means if you send two events to a client,
            // one being "immediately" and one being different, the
            // immediately-event has the higher priority, event if the
            // other one is in the past
            rval = (_lhs->val.t == 1)
                   ? (_rhs->val.t == 1)
                     ? 0
                     : -1 // _lhs has higher priority => _lhs < _rhs
                   : (_rhs->val.t == 1)
                     ? 1
                     : cmp_3way(_lhs->val.t, _rhs->val.t);
            break;
        case 'm':
            rval = memcmp(_lhs->val.m, _rhs->val.m, 4);
            break;
        case 's':
        case 'S':
            rval = (_lhs->val.s == NULL || _rhs->val.s == NULL)
                 ? cmp_3way(_lhs->val.s, _rhs->val.s)
                 : strcmp(_lhs->val.s, _rhs->val.s);
            break;
        case 'b':
        {
            int32_t lbs = _lhs->val.b.len,
                    rbs = _rhs->val.b.len;
            int32_t minlen = (lbs < rbs) ? lbs : rbs;
            rval = memcmp(_lhs->val.b.data, _rhs->val.b.data, minlen);
            if(lbs != rbs && !rval)
            {
                // both equal until here
                // the string that ends here is lexicographically smaller
                rval = (lbs > rbs)
                       ? _lhs->val.b.data[minlen]
                       : -_rhs->val.b.data[minlen];
            }

            break;
        }
        case 'a':
        {
            int32_t llen = rtosc_av_arr_len(_lhs), rlen = rtosc_av_arr_len(_rhs);
            if(     rtosc_av_arr_type(_lhs) != rtosc_av_arr_type(_rhs)
               && !(rtosc_av_arr_type(_lhs) == 'T' && rtosc_av_arr_type(_rhs))
               && !(rtosc_av_arr_type(_lhs) == 'F' && rtosc_av_arr_type(_rhs)))
                rval = (rtosc_av_arr_type(_lhs) > rtosc_av_arr_type(_rhs)) ? 1 : -1;
            else
            {
                // the arg vals differ in this array => compare and return
                rval = rtosc_arg_vals_cmp(_lhs+1, _rhs+1, llen, rlen, opt);
            }
            break;
        }
        case '-':
            rval = -1;
            // no recovery: the programmer did not pass the right args, and
            // we don't have a function to compare ranges here
            assert(false);
            break;
        default:
            rval = -1;
            assert(false);
    }
    else
    {
        rval = (_lhs->type > _rhs->type) ? 1 : -1;
    }

    return rval;

#undef mfabs
#undef cmp_3way
}